

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O2

void rw_mutex_cv_ping_pong(ping_pong *pp,int parity)

{
  pthread_rwlock_t *__rwlock;
  uint uVar1;
  nsync_time abs_deadline;
  
  __rwlock = &pp->rwmutex;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  while (uVar1 = pp->i, (int)uVar1 < pp->limit) {
    while ((uVar1 & 1) == parity) {
      abs_deadline.tv_nsec = 999999999;
      abs_deadline.tv_sec = 0x7fffffffffffffff;
      nsync_cv_wait_with_deadline_generic
                (pp->cv + (uint)parity,__rwlock,void_pthread_rwlock_wrlock,
                 void_pthread_rwlock_unlock,abs_deadline,(nsync_note)0x0);
      uVar1 = pp->i;
    }
    pp->i = uVar1 + 1;
    nsync_cv_signal(pp->cv + (1 - parity));
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  ping_pong_done(pp);
  return;
}

Assistant:

static void rw_mutex_cv_ping_pong (ping_pong *pp, int parity) {
	pthread_rwlock_wrlock (&pp->rwmutex);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_cv_wait_with_deadline_generic (&pp->cv[parity], &pp->rwmutex,
						             &void_pthread_rwlock_wrlock,
						             &void_pthread_rwlock_unlock,
						             nsync_time_no_deadline, NULL);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1-parity]);
	}
	pthread_rwlock_unlock (&pp->rwmutex);
	ping_pong_done (pp);
}